

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testBaseURI(DOMTest *this,XercesDOMParser *parser)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  DOMNode *pDVar5;
  int iVar6;
  long lVar7;
  wchar16 *pwVar8;
  wchar16 *pwVar9;
  long *plVar10;
  wchar16 *pwVar11;
  XMLSize_t XVar12;
  ulong uVar13;
  wchar16 *pwVar14;
  wchar16 *pwVar15;
  wchar16 *pwVar16;
  wchar16 *pwVar17;
  wchar16 *pwVar18;
  wchar16 *pwVar19;
  wchar16 *pwVar20;
  wchar16 *pwVar21;
  DOMNode *level2;
  DOMNode *level1;
  DOMNode *node;
  XMLCh *http_barfoofoobar;
  XMLCh *http_barfoo;
  XMLCh *http_carcar;
  XMLCh *file_carfoobarbar;
  XMLCh *file_carfoo;
  XMLCh *file_autobar;
  XMLCh *foocarbar;
  XMLCh *base_foocarbar;
  XMLCh *foobarbar;
  XMLCh *base_foobarbar;
  XMLCh *foobar;
  XMLCh *base_foobar;
  XMLCh *docBaseURIRoot;
  XMLCh *docBaseURI;
  DOMDocument *document;
  XMLCh *filePath;
  XMLCh *fileSchema;
  OutOfMemoryException *anon_var_0;
  bool local_21;
  bool OK;
  XercesDOMParser *parser_local;
  DOMTest *this_local;
  
  local_21 = true;
  xercesc_4_0::AbstractDOMParser::parse((char *)parser);
  lVar7 = xercesc_4_0::AbstractDOMParser::getErrorCount();
  if (lVar7 == 0) {
    pwVar8 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("file://",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar9 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("samples/data/personal-schema.xml",
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar10 = (long *)xercesc_4_0::AbstractDOMParser::getDocument();
    pwVar11 = (wchar16 *)(**(code **)(plVar10[3] + 0xf8))(plVar10 + 3);
    iVar6 = xercesc_4_0::XMLString::patternMatch(pwVar11,pwVar8);
    if (iVar6 == -1) {
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x1220);
    }
    local_21 = iVar6 != -1;
    iVar6 = xercesc_4_0::XMLString::patternMatch(pwVar11,pwVar9);
    if (iVar6 == -1) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x1225);
    }
    XVar12 = xercesc_4_0::XMLString::stringLen(pwVar11);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = XVar12;
    uVar13 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    pwVar8 = (wchar16 *)operator_new__(uVar13);
    iVar6 = xercesc_4_0::XMLString::lastIndexOf(pwVar11,L'/');
    xercesc_4_0::XMLString::copyNString(pwVar8,pwVar11,(long)(iVar6 + 1));
    XVar12 = xercesc_4_0::XMLString::stringLen(pwVar8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = XVar12 + 8;
    uVar13 = SUB168(auVar2 * ZEXT816(2),0);
    if (SUB168(auVar2 * ZEXT816(2),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    pwVar9 = (wchar16 *)operator_new__(uVar13);
    xercesc_4_0::XMLString::copyString(pwVar9,pwVar8);
    pwVar14 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("foo/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::XMLString::catString(pwVar9,pwVar14);
    XVar12 = xercesc_4_0::XMLString::stringLen(pwVar8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = XVar12 + 0xc;
    uVar13 = SUB168(auVar3 * ZEXT816(2),0);
    if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    pwVar14 = (wchar16 *)operator_new__(uVar13);
    xercesc_4_0::XMLString::copyString(pwVar14,pwVar8);
    pwVar15 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("foo/bar/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::XMLString::catString(pwVar14,pwVar15);
    XVar12 = xercesc_4_0::XMLString::stringLen(pwVar8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = XVar12 + 0xc;
    uVar13 = SUB168(auVar4 * ZEXT816(2),0);
    if (SUB168(auVar4 * ZEXT816(2),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    pwVar15 = (wchar16 *)operator_new__(uVar13);
    xercesc_4_0::XMLString::copyString(pwVar15,pwVar8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("foo/car/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::XMLString::catString(pwVar15,pwVar8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("file:///auto/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar16 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("file:///car/foo/",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar17 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("file:///car/foo/bar/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar18 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("http://www.example.com/car/car",
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar19 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("http://www.example.com/bar/foo/",
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar20 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("http://www.example.com/bar/foo/foo/bar",
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    level1 = (DOMNode *)(**(code **)(plVar10[3] + 0x38))(plVar10 + 3);
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 7) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar21 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar21,pwVar11);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x124c);
    }
    plVar10 = (long *)(**(code **)(*plVar10 + 0x68))();
    pwVar21 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar21,pwVar11);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI, failed at line %i\n",0x1255);
    }
    level1 = (DOMNode *)(**(code **)(*plVar10 + 0x38))();
    while (pDVar5 = level1, iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x38))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar11 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar9);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x1268);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x38))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar11 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar14);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x1273);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar11 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar15);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x127e);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 7) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar11 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar9);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x1289);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x50))();
    while (pDVar5 = level1, iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar9 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar9,pwVar8);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x1296);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x38))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar8 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar16);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x12a1);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x38))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar8 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar17);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x12ac);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x50))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar8 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar18);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x12b7);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x38))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar8 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar19);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x12c2);
    }
    level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x38))();
    while (iVar6 = (**(code **)(*(long *)level1 + 0x20))(), iVar6 != 1) {
      level1 = (DOMNode *)(**(code **)(*(long *)level1 + 0x50))();
    }
    pwVar8 = (wchar16 *)(**(code **)(*(long *)level1 + 0xf8))();
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar20);
    if (iVar6 != 0) {
      local_21 = false;
      fprintf(_stderr,"checking baseURI failed at line %i\n",0x12cd);
    }
  }
  else {
    printf("baseURI test was not carried out\n");
  }
  return local_21;
}

Assistant:

bool DOMTest::testBaseURI(XercesDOMParser* parser) {

    bool OK = true;

    try {
        // this one assumes executing in samples/data where personal-schema.xml resides
        // please modify if this is not correct
        parser->parse("personal-schema.xml");
    }
    catch (const OutOfMemoryException&)
    {
	    fprintf(stderr, "OutOfMemoryException.\n");
	    return false;
    }
    catch (...) {
        fprintf(stderr, "parsing personal-schema.xml failed at line %i\n", __LINE__);
        return false;
    }

    // test only if there is no error
    if (!parser->getErrorCount()) {

        //Setup testing strings
        XMLCh *fileSchema = XMLString::transcode("file://");
        XMLCh *filePath = XMLString::transcode("samples/data/personal-schema.xml");

        //Test document baseURI
        DOMDocument *document = parser->getDocument();

        //The baseURI should contain `file://' and `samples/data/personal-schema.xml'
        const XMLCh *docBaseURI = document->getBaseURI();

        if(XMLString::patternMatch(docBaseURI, fileSchema) == -1) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n", __LINE__);
        }

        if(XMLString::patternMatch(docBaseURI, filePath) == -1) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n", __LINE__);
        }

        //Create relative paths from document baseURI

        XMLCh *docBaseURIRoot = new XMLCh [ XMLString::stringLen(docBaseURI) ];
        XMLString::copyNString(docBaseURIRoot, docBaseURI, XMLString::lastIndexOf(docBaseURI, chForwardSlash) + 1);

        XMLCh *base_foobar = new XMLCh [ XMLString::stringLen(docBaseURIRoot) + 8];
        XMLString::copyString(base_foobar, docBaseURIRoot);
        XMLCh *foobar = XMLString::transcode("foo/bar");
        XMLString::catString(base_foobar, foobar);

        XMLCh *base_foobarbar = new XMLCh [ XMLString::stringLen(docBaseURIRoot) + 12];
        XMLString::copyString(base_foobarbar, docBaseURIRoot);
        XMLCh *foobarbar = XMLString::transcode("foo/bar/bar");
        XMLString::catString(base_foobarbar, foobarbar);

        XMLCh *base_foocarbar = new XMLCh [ XMLString::stringLen(docBaseURIRoot) + 12];
        XMLString::copyString(base_foocarbar, docBaseURIRoot);
        XMLCh *foocarbar = XMLString::transcode("foo/car/bar");
        XMLString::catString(base_foocarbar, foocarbar);

        XMLCh *file_autobar = XMLString::transcode("file:///auto/bar");
        XMLCh *file_carfoo = XMLString::transcode("file:///car/foo/");
        XMLCh *file_carfoobarbar = XMLString::transcode("file:///car/foo/bar/bar");

        XMLCh *http_carcar = XMLString::transcode("http://www.example.com/car/car");
        XMLCh *http_barfoo = XMLString::transcode("http://www.example.com/bar/foo/");
        XMLCh *http_barfoofoobar = XMLString::transcode("http://www.example.com/bar/foo/foo/bar");

        //Processing instruction before Document Element (has document baseURI)

        DOMNode *node = document->getFirstChild();
        while(node->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), docBaseURI) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        //Document Element baseURI (same as document)

        node = document->getDocumentElement();

        if(XMLString::compareString(node->getBaseURI(), docBaseURI) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI, failed at line %i\n", __LINE__);
        }

        // <level 1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        DOMNode *level1 = node;

        // <one>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foobarbar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner2>

        node = node->getNextSibling();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foocarbar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <?proc-inst-2?>

        node = node->getNextSibling();
        while(node->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <level2>

        node = level1->getNextSibling();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        DOMNode *level2 = node;

        if(XMLString::compareString(node->getBaseURI(), file_autobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <two>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), file_carfoo) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), file_carfoobarbar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <level3>

        node = level2->getNextSibling();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), http_carcar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <three>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), http_barfoo) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), http_barfoofoobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }
    }
    else {
        printf("baseURI test was not carried out\n");
    }

    return OK;
}